

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall gl4cts::TextureViewTestErrors::deinit(TextureViewTestErrors *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  if (this->m_reference_immutable_to_1d_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_1d_id);
    this->m_reference_immutable_to_1d_id = 0;
  }
  if (this->m_reference_immutable_to_2d_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_2d_id);
    this->m_reference_immutable_to_2d_id = 0;
  }
  if (this->m_reference_immutable_to_2d_array_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_2d_array_id);
    this->m_reference_immutable_to_2d_array_id = 0;
  }
  if (this->m_reference_immutable_to_2d_array_32_by_33_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_2d_array_32_by_33_id);
    this->m_reference_immutable_to_2d_array_32_by_33_id = 0;
  }
  if (this->m_reference_immutable_to_2d_multisample_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_2d_multisample_id);
    this->m_reference_immutable_to_2d_multisample_id = 0;
  }
  if (this->m_reference_immutable_to_3d_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_3d_id);
    this->m_reference_immutable_to_3d_id = 0;
  }
  if (this->m_reference_immutable_to_cube_map_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_cube_map_id);
    this->m_reference_immutable_to_cube_map_id = 0;
  }
  if (this->m_reference_immutable_to_cube_map_array_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_cube_map_array_id);
    this->m_reference_immutable_to_cube_map_array_id = 0;
  }
  if (this->m_reference_immutable_to_rectangle_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_immutable_to_rectangle_id);
    this->m_reference_immutable_to_rectangle_id = 0;
  }
  if (this->m_reference_mutable_to_2d_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_reference_mutable_to_2d_id);
    this->m_reference_mutable_to_2d_id = 0;
  }
  if (this->m_test_modified_to_id_1 != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_test_modified_to_id_1);
    this->m_test_modified_to_id_1 = 0;
  }
  if (this->m_test_modified_to_id_2 != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_test_modified_to_id_2);
    this->m_test_modified_to_id_2 = 0;
  }
  if (this->m_test_modified_to_id_3 != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_test_modified_to_id_3);
    this->m_test_modified_to_id_3 = 0;
  }
  if (this->m_view_bound_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_view_bound_to_id);
    this->m_view_bound_to_id = 0;
  }
  if (this->m_view_never_bound_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_view_never_bound_to_id);
    this->m_view_never_bound_to_id = 0;
  }
  return;
}

Assistant:

void TextureViewTestErrors::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_reference_immutable_to_1d_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_1d_id);

		m_reference_immutable_to_1d_id = 0;
	}

	if (m_reference_immutable_to_2d_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_2d_id);

		m_reference_immutable_to_2d_id = 0;
	}

	if (m_reference_immutable_to_2d_array_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_2d_array_id);

		m_reference_immutable_to_2d_array_id = 0;
	}

	if (m_reference_immutable_to_2d_array_32_by_33_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_2d_array_32_by_33_id);

		m_reference_immutable_to_2d_array_32_by_33_id = 0;
	}

	if (m_reference_immutable_to_2d_multisample_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_2d_multisample_id);

		m_reference_immutable_to_2d_multisample_id = 0;
	}

	if (m_reference_immutable_to_3d_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_3d_id);

		m_reference_immutable_to_3d_id = 0;
	}

	if (m_reference_immutable_to_cube_map_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_cube_map_id);

		m_reference_immutable_to_cube_map_id = 0;
	}

	if (m_reference_immutable_to_cube_map_array_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_cube_map_array_id);

		m_reference_immutable_to_cube_map_array_id = 0;
	}

	if (m_reference_immutable_to_rectangle_id != 0)
	{
		gl.deleteTextures(1, &m_reference_immutable_to_rectangle_id);

		m_reference_immutable_to_rectangle_id = 0;
	}

	if (m_reference_mutable_to_2d_id != 0)
	{
		gl.deleteTextures(1, &m_reference_mutable_to_2d_id);

		m_reference_mutable_to_2d_id = 0;
	}

	if (m_test_modified_to_id_1 != 0)
	{
		gl.deleteTextures(1, &m_test_modified_to_id_1);

		m_test_modified_to_id_1 = 0;
	}

	if (m_test_modified_to_id_2 != 0)
	{
		gl.deleteTextures(1, &m_test_modified_to_id_2);

		m_test_modified_to_id_2 = 0;
	}

	if (m_test_modified_to_id_3 != 0)
	{
		gl.deleteTextures(1, &m_test_modified_to_id_3);

		m_test_modified_to_id_3 = 0;
	}

	if (m_view_bound_to_id != 0)
	{
		gl.deleteTextures(1, &m_view_bound_to_id);

		m_view_bound_to_id = 0;
	}

	if (m_view_never_bound_to_id != 0)
	{
		gl.deleteTextures(1, &m_view_never_bound_to_id);

		m_view_never_bound_to_id = 0;
	}
}